

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

tm_conflict * http_gmtime(time_t timer,tm_conflict *tmbuf)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  size_t i;
  ulong uVar8;
  long lVar9;
  int iVar10;
  time_t local_8;
  
  if (timer < 0) {
    local_8 = timer;
    tmbuf = (tm_conflict *)gmtime_r(&local_8,(tm *)tmbuf);
  }
  else {
    tmbuf->tm_sec = 0;
    tmbuf->tm_min = 0;
    tmbuf->tm_hour = 0;
    tmbuf->tm_mday = 0;
    tmbuf->tm_mon = 0;
    tmbuf->tm_year = 0x46;
    tmbuf->tm_wday = 0;
    tmbuf->tm_yday = 0;
    *(undefined8 *)&tmbuf->tm_isdst = 0;
    tmbuf->tm_gmtoff = 0;
    tmbuf->tm_zone = (char *)0x0;
    iVar2 = (int)((ulong)timer / 0x3c);
    tmbuf->tm_sec = (int)timer + iVar2 * -0x3c;
    iVar10 = (int)((ulong)timer / 0xe10);
    tmbuf->tm_min = iVar10 * -0x3c + iVar2;
    uVar3 = (ulong)timer / 0x15180;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3 + 4;
    tmbuf->tm_hour = iVar10 + (int)uVar3 * -0x18;
    tmbuf->tm_wday = (int)(uVar3 + 4) + SUB164(auVar1 * ZEXT816(0x2492492492492493),8) * -7;
    if (0x5e0c0b2 < (ulong)timer >> 7) {
      uVar8 = 0x47561;
      if (uVar3 < 0x47561) {
        uVar8 = uVar3;
      }
      uVar8 = ((uVar3 - uVar8) + 0x23ab0) / 0x23ab1;
      uVar3 = (uVar3 - 0x23ab1) + uVar8 * -0x23ab1;
      tmbuf->tm_year = (int)uVar8 * 400 + tmbuf->tm_year + 400;
    }
    if (0x8eab < (long)uVar3) {
      iVar2 = tmbuf->tm_year;
      do {
        iVar2 = iVar2 + 100;
        uVar3 = (uVar3 - (((uint)((ulong)((long)iVar2 * 0x51eb851f) >> 0x25) - (iVar2 >> 0x1f) & 3)
                         == 0)) - 0x8eac;
      } while (0x8eab < (long)uVar3);
      tmbuf->tm_year = iVar2;
    }
    if (0x2da7 < (long)uVar3) {
      uVar8 = 0x5b4f;
      if ((long)uVar3 < 0x5b4f) {
        uVar8 = uVar3;
      }
      uVar8 = ((uVar3 - uVar8) + 0x2da7) / 0x2da8;
      uVar3 = (uVar3 - 0x2da8) + uVar8 * -0x2da8;
      tmbuf->tm_year = (int)uVar8 * 0x20 + tmbuf->tm_year + 0x20;
    }
    if (0xb69 < (long)uVar3) {
      uVar8 = 0x16d3;
      if ((long)uVar3 < 0x16d3) {
        uVar8 = uVar3;
      }
      uVar8 = ((uVar3 - uVar8) + 0xb69) / 0xb6a;
      uVar3 = (uVar3 - 0xb6a) + uVar8 * -0xb6a;
      tmbuf->tm_year = tmbuf->tm_year + (int)uVar8 * 8 + 8;
    }
    if (0x5b4 < (long)uVar3) {
      uVar8 = 0xb69;
      if ((long)uVar3 < 0xb69) {
        uVar8 = uVar3;
      }
      uVar8 = ((uVar3 - uVar8) + 0x5b4) / 0x5b5;
      uVar3 = (uVar3 - 0x5b5) + uVar8 * -0x5b5;
      tmbuf->tm_year = tmbuf->tm_year + (int)uVar8 * 4 + 4;
    }
    if (0x16c < (long)uVar3) {
      uVar6 = tmbuf->tm_year;
      do {
        uVar7 = uVar6 + 1;
        if ((uVar7 & 3) == 0) {
          if (uVar3 == 0x16d) {
            uVar3 = 0x16d;
            uVar7 = uVar6;
            break;
          }
          uVar3 = uVar3 - 0x16e;
        }
        else {
          uVar3 = uVar3 - 0x16d;
        }
        uVar6 = uVar7;
      } while (0x16c < (long)uVar3);
      tmbuf->tm_year = uVar7;
    }
    lVar4 = uVar3 + 1;
    tmbuf->tm_yday = (int)lVar4;
    if ((tmbuf->tm_year & 3U) == 1) {
      lVar9 = 0;
      do {
        iVar2 = (int)lVar4;
        lVar5 = lVar4 - (ulong)"\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"
                               [lVar9];
        if (lVar5 == 0 ||
            lVar4 < (long)(ulong)"\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"
                                 [lVar9]) break;
        tmbuf->tm_mon = tmbuf->tm_mon + 1;
        lVar9 = lVar9 + 1;
        iVar2 = (int)lVar5;
        lVar4 = lVar5;
      } while (lVar9 != 0xc);
    }
    else {
      lVar9 = -0xc;
      do {
        iVar2 = (int)lVar4;
        lVar5 = lVar4 - (ulong)(byte)"FATAL: HTTP SSL/TLS required but unavailable!"[lVar9];
        if (lVar5 == 0 ||
            lVar4 < (long)(ulong)(byte)"FATAL: HTTP SSL/TLS required but unavailable!"[lVar9])
        break;
        tmbuf->tm_mon = tmbuf->tm_mon + 1;
        iVar2 = (int)lVar5;
        lVar9 = lVar9 + 1;
        lVar4 = lVar5;
      } while (lVar9 != 0);
    }
    tmbuf->tm_mday = iVar2;
  }
  return tmbuf;
}

Assistant:

struct tm *http_gmtime(time_t timer, struct tm *tmbuf) {
  // static char* DAYS[] = {"Sun", "Mon", "Tue", "Wed", "Thu", "Fri",
  // "Sat"}; static char * Months = {  "Jan", "Feb", "Mar", "Apr", "May",
  // "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec"};
  static const uint8_t month_len[] = {
      31, 28, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31, // nonleap year
      31, 29, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31  // leap year
  };
  if (timer < 0)
    return gmtime_r(&timer, tmbuf);
  ssize_t a, b;
#if HAVE_TM_TM_ZONE
  *tmbuf = (struct tm){
      .tm_isdst = 0,
      .tm_year = 70, // tm_year == The number of years since 1900
      .tm_mon = 0,
      .tm_zone = "UTC",
  };
#else
  *tmbuf = (struct tm){
      .tm_isdst = 0,
      .tm_year = 70, // tm_year == The number of years since 1900
      .tm_mon = 0,
  };
#endif
  // for seconds up to weekdays, we build up, as small values clean up
  // larger values.
  a = (ssize_t)timer;
  b = a / 60;
  tmbuf->tm_sec = a - (b * 60);
  a = b / 60;
  tmbuf->tm_min = b - (a * 60);
  b = a / 24;
  tmbuf->tm_hour = a - (b * 24);
  // day of epoch was a thursday. Add + 4 so sunday == 0...
  tmbuf->tm_wday = (b + 4) % 7;
// tmp == number of days since epoch
#define DAYS_PER_400_YEARS ((400 * 365) + 97)
  while (b >= DAYS_PER_400_YEARS) {
    tmbuf->tm_year += 400;
    b -= DAYS_PER_400_YEARS;
  }
#undef DAYS_PER_400_YEARS
#define DAYS_PER_100_YEARS ((100 * 365) + 24)
  while (b >= DAYS_PER_100_YEARS) {
    tmbuf->tm_year += 100;
    b -= DAYS_PER_100_YEARS;
    if (((tmbuf->tm_year / 100) & 3) ==
        0) // leap century divisable by 400 => add leap
      --b;
  }
#undef DAYS_PER_100_YEARS
#define DAYS_PER_32_YEARS ((32 * 365) + 8)
  while (b >= DAYS_PER_32_YEARS) {
    tmbuf->tm_year += 32;
    b -= DAYS_PER_32_YEARS;
  }
#undef DAYS_PER_32_YEARS
#define DAYS_PER_8_YEARS ((8 * 365) + 2)
  while (b >= DAYS_PER_8_YEARS) {
    tmbuf->tm_year += 8;
    b -= DAYS_PER_8_YEARS;
  }
#undef DAYS_PER_8_YEARS
#define DAYS_PER_4_YEARS ((4 * 365) + 1)
  while (b >= DAYS_PER_4_YEARS) {
    tmbuf->tm_year += 4;
    b -= DAYS_PER_4_YEARS;
  }
#undef DAYS_PER_4_YEARS
  while (b >= 365) {
    tmbuf->tm_year += 1;
    b -= 365;
    if ((tmbuf->tm_year & 3) == 0) { // leap year
      if (b > 0) {
        --b;
        continue;
      } else {
        b += 365;
        --tmbuf->tm_year;
        break;
      }
    }
  }
  b++; /* day 1 of the year is 1, not 0. */
  tmbuf->tm_yday = b;
  if ((tmbuf->tm_year & 3) == 1) {
    // regular year
    for (size_t i = 0; i < 12; i++) {
      if (b <= month_len[i])
        break;
      b -= month_len[i];
      ++tmbuf->tm_mon;
    }
  } else {
    // leap year
    for (size_t i = 12; i < 24; i++) {
      if (b <= month_len[i])
        break;
      b -= month_len[i];
      ++tmbuf->tm_mon;
    }
  }
  tmbuf->tm_mday = b;
  return tmbuf;
}